

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keeper_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mStack_60;
  
  if (this[8] ==
      (keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
       )0x1) {
    bVar2 = match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                      ();
    return bVar2;
  }
  pcVar1 = (state->cur_)._M_current;
  save_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&mStack_60,(detail *)state,
             (match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)next);
  cVar3 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
  (state->action_list_).next = mStack_60.action_list_head_;
  state->action_list_tail_ = mStack_60.action_list_tail_;
  *mStack_60.action_list_tail_ = (actionable *)0x0;
  if (cVar3 == '\0') {
    bVar2 = false;
    reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (&mStack_60,state,false);
  }
  else {
    iVar4 = (*(next->
              super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_matchable[2])(next,state);
    if ((char)iVar4 == '\0') {
      restore_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&mStack_60,state);
      (state->cur_)._M_current = pcVar1;
      bVar2 = false;
    }
    else {
      reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&mStack_60,state,true);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            return Xpr::pure || this->pure_
              ? this->match_(state, next, mpl::true_())
              : this->match_(state, next, mpl::false_());
        }